

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

Var __thiscall
Js::CustomExternalWrapperObject::GetName
          (CustomExternalWrapperObject *this,ScriptContext *requestContext,PropertyId propertyId,
          Var *isPropertyNameNumeric,Var *propertyNameNumericValue)

{
  bool bVar1;
  uint32 nValue;
  ThreadContext *this_00;
  PropertyRecord *this_01;
  JavascriptLibrary *pJVar2;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  Var name;
  PropertyRecord *propertyRecord;
  Var *propertyNameNumericValue_local;
  Var *isPropertyNameNumeric_local;
  PropertyId propertyId_local;
  ScriptContext *requestContext_local;
  CustomExternalWrapperObject *this_local;
  
  this_00 = ScriptContext::GetThreadContext(requestContext);
  this_01 = ThreadContext::GetPropertyName(this_00,propertyId);
  bVar1 = PropertyRecord::IsSymbol(this_01);
  if (bVar1) {
    local_40 = (PropertyString *)ScriptContext::GetSymbol(requestContext,this_01);
  }
  else {
    local_40 = ScriptContext::GetPropertyString(requestContext,this_01);
  }
  bVar1 = PropertyRecord::IsNumeric(this_01);
  if (bVar1) {
    pJVar2 = ScriptContext::GetLibrary(requestContext);
    local_48 = JavascriptLibraryBase::GetTrue(&pJVar2->super_JavascriptLibraryBase);
  }
  else {
    pJVar2 = ScriptContext::GetLibrary(requestContext);
    local_48 = JavascriptLibraryBase::GetFalse(&pJVar2->super_JavascriptLibraryBase);
  }
  *isPropertyNameNumeric = local_48;
  bVar1 = PropertyRecord::IsNumeric(this_01);
  if (bVar1) {
    nValue = PropertyRecord::GetNumericValue(this_01);
    local_50 = JavascriptNumber::ToVar(nValue,requestContext);
  }
  else {
    local_50 = (Var)0x0;
  }
  *propertyNameNumericValue = local_50;
  return local_40;
}

Assistant:

Js::Var CustomExternalWrapperObject::GetName(Js::ScriptContext* requestContext, Js::PropertyId propertyId, Var * isPropertyNameNumeric, Var * propertyNameNumericValue)
{
    const Js::PropertyRecord* propertyRecord = requestContext->GetThreadContext()->GetPropertyName(propertyId);
    Js::Var name;
    if (propertyRecord->IsSymbol())
    {
        name = requestContext->GetSymbol(propertyRecord);
    }
    else
    {
        name = requestContext->GetPropertyString(propertyRecord);
    }

    *isPropertyNameNumeric = propertyRecord->IsNumeric() ? requestContext->GetLibrary()->GetTrue() : requestContext->GetLibrary()->GetFalse();
    *propertyNameNumericValue = propertyRecord->IsNumeric() ? JavascriptNumber::ToVar(propertyRecord->GetNumericValue(), requestContext) : nullptr;
    return name;
}